

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

void __thiscall sqlite::Connection::Stmt::Stmt(Stmt *this,string *sql,Connection *db)

{
  int sqlite_error_code;
  sqlite3 *psVar1;
  Logic_error *this_00;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->stmt_ = (sqlite3_stmt *)0x0;
  psVar1 = Connection::get_c_obj(db);
  this->db_ = psVar1;
  psVar1 = Connection::get_c_obj(db);
  sqlite_error_code =
       sqlite3_prepare_v2(psVar1,(sql->_M_dataplus)._M_p,(int)sql->_M_string_length + 1,this,0);
  if (sqlite_error_code == 0) {
    return;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  s_abi_cxx11_(&bStack_68,"Error parsing SQL: ",0x13);
  psVar1 = Connection::get_c_obj(db);
  __rhs = (char *)sqlite3_errmsg(psVar1);
  std::operator+(&local_48,&bStack_68,__rhs);
  Logic_error::Logic_error(this_00,&local_48,sql,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

Connection::Stmt::Stmt(const std::string & sql, Connection & db):
        db_(db.get_c_obj())
    {
        int status = sqlite3_prepare_v2(db.get_c_obj(), sql.c_str(), sql.length() + 1, &stmt_, NULL);

        if(status != SQLITE_OK)
        {
            throw Logic_error("Error parsing SQL: "s + sqlite3_errmsg(db.get_c_obj()), sql, status, db_);
        }
    }